

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O2

void __thiscall
glslang::TParseContextBase::error
          (TParseContextBase *this,TSourceLoc *loc,char *szReason,char *szToken,
          char *szExtraInfoFormat,...)

{
  EShMessages EVar1;
  TInputScanner *pTVar2;
  va_list args;
  
  EVar1 = (this->super_TParseVersions).messages;
  if (((EVar1 & EShMsgOnlyPreprocessor) == EShMsgDefault) &&
     (((-1 < (short)EVar1 || ((this->super_TParseVersions).numErrors < 1)) &&
      ((*(this->super_TParseVersions)._vptr_TParseVersions[0x4c])(this),
      ((this->super_TParseVersions).messages & EShMsgCascadingErrors) == EShMsgDefault)))) {
    pTVar2 = (this->super_TParseVersions).currentScanner;
    pTVar2->endOfFileReached = true;
    pTVar2->currentSource = pTVar2->numSources;
  }
  return;
}

Assistant:

void C_DECL TParseContextBase::error(const TSourceLoc& loc, const char* szReason, const char* szToken,
                                     const char* szExtraInfoFormat, ...)
{
    if (messages & EShMsgOnlyPreprocessor)
        return;
    // If enhanced msg readability, only print one error
    if (messages & EShMsgEnhanced && numErrors > 0)
        return;
    va_list args;
    va_start(args, szExtraInfoFormat);
    outputMessage(loc, szReason, szToken, szExtraInfoFormat, EPrefixError, args);
    va_end(args);

    if ((messages & EShMsgCascadingErrors) == 0)
        currentScanner->setEndOfInput();
}